

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O2

vector<common_sampler_type,_std::allocator<common_sampler_type>_> *
common_sampler_types_from_chars
          (vector<common_sampler_type,_std::allocator<common_sampler_type>_> *__return_storage_ptr__
          ,string *chars)

{
  iterator iVar1;
  size_type sVar2;
  char *c;
  pointer __k;
  unordered_map<char,_common_sampler_type,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_common_sampler_type>_>_>
  sampler_name_map;
  undefined1 local_a3;
  undefined1 local_a2;
  undefined1 local_a1;
  _Hashtable<char,_std::pair<const_char,_common_sampler_type>,_std::allocator<std::pair<const_char,_common_sampler_type>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_a0;
  undefined1 local_68 [4];
  undefined4 local_64;
  undefined1 local_60;
  undefined4 local_5c;
  undefined1 local_58;
  undefined4 local_54;
  undefined1 local_50;
  undefined4 local_4c;
  undefined1 local_48;
  undefined4 local_44;
  undefined1 local_40;
  undefined4 local_3c;
  undefined1 local_38;
  undefined4 local_34;
  undefined1 local_30;
  undefined4 local_2c;
  undefined1 local_28;
  undefined4 local_24;
  
  local_68[0] = 100;
  local_64 = 1;
  local_60 = 0x6b;
  local_5c = 2;
  local_58 = 0x79;
  local_54 = 6;
  local_50 = 0x70;
  local_4c = 3;
  local_48 = 0x6d;
  local_44 = 4;
  local_40 = 0x74;
  local_3c = 7;
  local_38 = 0x78;
  local_34 = 8;
  local_30 = 0x69;
  local_2c = 9;
  local_28 = 0x65;
  local_24 = 10;
  std::
  _Hashtable<char,std::pair<char_const,common_sampler_type>,std::allocator<std::pair<char_const,common_sampler_type>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<char_const,common_sampler_type>const*>
            ((_Hashtable<char,std::pair<char_const,common_sampler_type>,std::allocator<std::pair<char_const,common_sampler_type>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_a0,local_68,&stack0xffffffffffffffe0,0,&local_a1,&local_a2,&local_a3);
  (__return_storage_ptr__->
  super__Vector_base<common_sampler_type,_std::allocator<common_sampler_type>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<common_sampler_type,_std::allocator<common_sampler_type>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<common_sampler_type,_std::allocator<common_sampler_type>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<common_sampler_type,_std::allocator<common_sampler_type>_>::reserve
            (__return_storage_ptr__,chars->_M_string_length);
  __k = (chars->_M_dataplus)._M_p;
  for (sVar2 = chars->_M_string_length; sVar2 != 0; sVar2 = sVar2 - 1) {
    iVar1 = std::
            _Hashtable<char,_std::pair<const_char,_common_sampler_type>,_std::allocator<std::pair<const_char,_common_sampler_type>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&local_a0,__k);
    if (iVar1.super__Node_iterator_base<std::pair<const_char,_common_sampler_type>,_false>._M_cur !=
        (__node_type *)0x0) {
      std::vector<common_sampler_type,_std::allocator<common_sampler_type>_>::push_back
                (__return_storage_ptr__,
                 (value_type *)
                 ((long)iVar1.
                        super__Node_iterator_base<std::pair<const_char,_common_sampler_type>,_false>
                        ._M_cur + 0xc));
    }
    __k = __k + 1;
  }
  std::
  _Hashtable<char,_std::pair<const_char,_common_sampler_type>,_std::allocator<std::pair<const_char,_common_sampler_type>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_a0);
  return __return_storage_ptr__;
}

Assistant:

std::vector<common_sampler_type> common_sampler_types_from_chars(const std::string & chars) {
    std::unordered_map<char, common_sampler_type> sampler_name_map = {
        { common_sampler_type_to_chr(COMMON_SAMPLER_TYPE_DRY),         COMMON_SAMPLER_TYPE_DRY },
        { common_sampler_type_to_chr(COMMON_SAMPLER_TYPE_TOP_K),       COMMON_SAMPLER_TYPE_TOP_K },
        { common_sampler_type_to_chr(COMMON_SAMPLER_TYPE_TYPICAL_P),   COMMON_SAMPLER_TYPE_TYPICAL_P },
        { common_sampler_type_to_chr(COMMON_SAMPLER_TYPE_TOP_P),       COMMON_SAMPLER_TYPE_TOP_P },
        { common_sampler_type_to_chr(COMMON_SAMPLER_TYPE_MIN_P),       COMMON_SAMPLER_TYPE_MIN_P },
        { common_sampler_type_to_chr(COMMON_SAMPLER_TYPE_TEMPERATURE), COMMON_SAMPLER_TYPE_TEMPERATURE },
        { common_sampler_type_to_chr(COMMON_SAMPLER_TYPE_XTC),         COMMON_SAMPLER_TYPE_XTC },
        { common_sampler_type_to_chr(COMMON_SAMPLER_TYPE_INFILL),      COMMON_SAMPLER_TYPE_INFILL },
        { common_sampler_type_to_chr(COMMON_SAMPLER_TYPE_PENALTIES),   COMMON_SAMPLER_TYPE_PENALTIES },
    };

    std::vector<common_sampler_type> samplers;
    samplers.reserve(chars.size());

    for (const auto & c : chars) {
        const auto sampler = sampler_name_map.find(c);
        if (sampler != sampler_name_map.end()) {
            samplers.push_back(sampler->second);
        }
    }

    return samplers;
}